

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void send_thread(int sockfd)

{
  int iVar1;
  int extraout_EAX;
  size_t __n;
  ssize_t sVar2;
  
  do {
    wclear(typewin);
    wattr_on(typewin,0x6600,0);
    iVar1 = wmove(typewin,0,0);
    if (iVar1 != -1) {
      whline(typewin,0x20,ncolums);
    }
    mvwprintw(typewin,0,ncolums + -10,"0/%d",1000);
    wattr_off(typewin,0x6600,0);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
    if (iVar1 != 0) goto LAB_00102819;
    mvwprintw(typewin,1,0,">> ");
    wrefresh(typewin);
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
    memset(msg,0,1000);
    input(typewin,msg,1000,true);
    __n = strlen(msg);
    sVar2 = send(sockfd,msg,__n,0);
  } while (1 < (int)sVar2 + 1U);
  printf("Erro ao enviar mensagem");
  exit_();
  iVar1 = extraout_EAX;
LAB_00102819:
  std::__throw_system_error(iVar1);
}

Assistant:

void send_thread(int sockfd) {
  while(1) {

    wclear(typewin);
    wattron(typewin, COLOR_PAIR(102));
    mvwhline(typewin, 0, 0, ' ', ncolums);
    mvwprintw(typewin, 0, ncolums - 10, "0/%d", MSG_LEN);
    wattroff(typewin, COLOR_PAIR(102));

    mutwin.lock();
    mvwprintw(typewin, 1, 0, ">> ");
    wrefresh(typewin);
    mutwin.unlock();

    memset(msg,0,MSG_LEN);
    input(typewin, msg, MSG_LEN, true);

    int mlen = send(sockfd, msg, strlen(msg), 0);
    if (mlen == -1 || mlen == 0) {
      printf("Erro ao enviar mensagem");
      exit_();
    }
  }
}